

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

bool __thiscall qpdf::Array::setAt(Array *this,int at,QPDFObjectHandle *oh)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  int iVar2;
  QPDF_Array *pQVar3;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  key_type local_24;
  
  if ((-1 < at) && (iVar2 = size(this), at < iVar2)) {
    pQVar3 = array(this);
    checkOwnership(this,oh);
    _Var1._M_head_impl =
         (pQVar3->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                ((pQVar3->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start + (uint)at);
    }
    else {
      this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                std::
                map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                ::operator[](&(_Var1._M_head_impl)->elements,&local_24);
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
    return true;
  }
  return false;
}

Assistant:

bool
Array::setAt(int at, QPDFObjectHandle const& oh)
{
    if (at < 0 || at >= size()) {
        return false;
    }
    auto a = array();
    checkOwnership(oh);
    if (a->sp) {
        a->sp->elements[at] = oh;
    } else {
        a->elements[size_t(at)] = oh;
    }
    return true;
}